

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldRejectMalformedBasicAuth_Test::
~BasicAuthIntegrationTest_shouldRejectMalformedBasicAuth_Test
          (BasicAuthIntegrationTest_shouldRejectMalformedBasicAuth_Test *this)

{
  BasicAuthIntegrationTest::~BasicAuthIntegrationTest(&this->super_BasicAuthIntegrationTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldRejectMalformedBasicAuth) {
  std::unique_ptr<curl_slist, decltype(&curl_slist_free_all)> header(
      curl_slist_append(nullptr, "Authorization: Basic YWJj"),
      curl_slist_free_all);

  fetchPrePerform_ = [&header](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPHEADER, header.get());
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 401);
}